

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb_trimwhite(char *s)

{
  char *__s;
  size_t sVar1;
  ushort **ppuVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  
  __s = stb_skipwhite(s);
  sVar1 = strlen(__s);
  uVar4 = (uint)sVar1;
  pcVar6 = __s + (sVar1 & 0xffffffff);
  do {
    pcVar6 = pcVar6 + -1;
    uVar5 = (uint)sVar1;
    uVar3 = (int)uVar4 >> 0x1f & uVar4;
    if ((int)uVar5 < 1) break;
    ppuVar2 = __ctype_b_loc();
    sVar1 = (size_t)(uVar5 - 1);
    uVar3 = uVar5;
  } while ((*(byte *)((long)*ppuVar2 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
  __s[(int)uVar3] = '\0';
  return __s;
}

Assistant:

char *stb_trimwhite(char *s)
{
   int i,n;
   s = stb_skipwhite(s);
   n = (int) strlen(s);
   for (i=n-1; i >= 0; --i)
      if (!isspace(s[i]))
         break;
   s[i+1] = 0;
   return s;
}